

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

int str_find_aux(lua_State *L,int find)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  lua_Integer pos;
  ptrdiff_t pVar4;
  char *pcVar5;
  int in_ESI;
  lua_State *in_RDI;
  bool bVar6;
  char *res;
  char *s1;
  int anchor;
  MatchState ms;
  char *s2;
  ptrdiff_t init;
  char *p;
  char *s;
  size_t l2;
  size_t l1;
  uint local_284;
  size_t *in_stack_fffffffffffffd80;
  char *in_stack_fffffffffffffd88;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 in_stack_fffffffffffffd94;
  char *in_stack_fffffffffffffd98;
  char *in_stack_fffffffffffffdc8;
  char *in_stack_fffffffffffffdd0;
  MatchState *in_stack_fffffffffffffdd8;
  ulong local_40;
  long local_28;
  size_t local_20;
  
  pcVar2 = luaL_checklstring((lua_State *)
                             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                             (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                             in_stack_fffffffffffffd80);
  pcVar3 = luaL_checklstring((lua_State *)
                             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                             (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                             in_stack_fffffffffffffd80);
  pos = luaL_optinteger((lua_State *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                        (int)((ulong)in_stack_fffffffffffffd88 >> 0x20),
                        (lua_Integer)in_stack_fffffffffffffd80);
  pVar4 = posrelat(pos,local_20);
  local_40 = pVar4 - 1;
  if ((long)local_40 < 0) {
    local_40 = 0;
  }
  else if (local_20 < local_40) {
    local_40 = local_20;
  }
  if ((in_ESI == 0) ||
     ((iVar1 = lua_toboolean((lua_State *)
                             CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                             (int)((ulong)in_stack_fffffffffffffd88 >> 0x20)), iVar1 == 0 &&
      (pcVar5 = strpbrk(pcVar3,"^$*+?.([%-"), pcVar5 != (char *)0x0)))) {
    local_284 = (uint)(*pcVar3 == '^');
    pcVar3 = pcVar2 + local_40;
    do {
      pcVar5 = match(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0,in_stack_fffffffffffffdc8);
      if (pcVar5 != (char *)0x0) {
        if (in_ESI != 0) {
          lua_pushinteger(in_RDI,(lua_Integer)(pcVar3 + (1 - (long)pcVar2)));
          lua_pushinteger(in_RDI,(long)pcVar5 - (long)pcVar2);
          iVar1 = push_captures((MatchState *)CONCAT44(local_284,in_stack_fffffffffffffd90),pcVar3,
                                pcVar5);
          return iVar1 + 2;
        }
        iVar1 = push_captures((MatchState *)CONCAT44(local_284,in_stack_fffffffffffffd90),pcVar3,
                              pcVar5);
        return iVar1;
      }
      bVar6 = pcVar3 < pcVar2 + local_20;
      pcVar3 = pcVar3 + 1;
    } while (bVar6 && local_284 == 0);
  }
  else {
    pcVar3 = lmemfind(in_stack_fffffffffffffd98,
                      CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                      in_stack_fffffffffffffd88,(size_t)in_stack_fffffffffffffd80);
    if (pcVar3 != (char *)0x0) {
      lua_pushinteger(in_RDI,(lua_Integer)(pcVar3 + (1 - (long)pcVar2)));
      lua_pushinteger(in_RDI,(lua_Integer)(pcVar3 + (local_28 - (long)pcVar2)));
      return 2;
    }
  }
  lua_pushnil(in_RDI);
  return 1;
}

Assistant:

static int str_find_aux(lua_State*L,int find){
size_t l1,l2;
const char*s=luaL_checklstring(L,1,&l1);
const char*p=luaL_checklstring(L,2,&l2);
ptrdiff_t init=posrelat(luaL_optinteger(L,3,1),l1)-1;
if(init<0)init=0;
else if((size_t)(init)>l1)init=(ptrdiff_t)l1;
if(find&&(lua_toboolean(L,4)||
strpbrk(p,"^$*+?.([%-")==NULL)){
const char*s2=lmemfind(s+init,l1-init,p,l2);
if(s2){
lua_pushinteger(L,s2-s+1);
lua_pushinteger(L,s2-s+l2);
return 2;
}
}
else{
MatchState ms;
int anchor=(*p=='^')?(p++,1):0;
const char*s1=s+init;
ms.L=L;
ms.src_init=s;
ms.src_end=s+l1;
do{
const char*res;
ms.level=0;
if((res=match(&ms,s1,p))!=NULL){
if(find){
lua_pushinteger(L,s1-s+1);
lua_pushinteger(L,res-s);
return push_captures(&ms,NULL,0)+2;
}
else
return push_captures(&ms,s1,res);
}
}while(s1++<ms.src_end&&!anchor);
}
lua_pushnil(L);
return 1;
}